

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O0

void __thiscall FIX::SocketAcceptor::~SocketAcceptor(SocketAcceptor *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_> local_18;
  iterator iter;
  SocketAcceptor *this_local;
  
  (this->super_Acceptor)._vptr_Acceptor = (_func_int **)&PTR__SocketAcceptor_003311a8;
  (this->super_Strategy)._vptr_Strategy = (_func_int **)&PTR__SocketAcceptor_00331220;
  iter._M_node = (_Base_ptr)this;
  std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>::_Rb_tree_iterator
            (&local_18);
  local_20 = (_Base_ptr)
             std::
             map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
             ::begin(&this->m_connections);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
         ::end(&this->m_connections);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>::operator->
                       (&local_18);
    if (ppVar2->second != (SocketConnection *)0x0) {
      (*(ppVar2->second->super_Responder)._vptr_Responder[1])();
    }
    std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>::operator++(&local_18);
  }
  std::
  map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
  ::~map(&this->m_connections);
  std::
  map<FIX::SessionID,_unsigned_short,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_unsigned_short>_>_>
  ::~map(&this->m_sessionToPort);
  std::
  map<unsigned_short,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
  ::~map(&this->m_portToSessions);
  SocketServer::Strategy::~Strategy(&this->super_Strategy);
  Acceptor::~Acceptor(&this->super_Acceptor);
  return;
}

Assistant:

SocketAcceptor::~SocketAcceptor() {
  SocketConnections::iterator iter;
  for (iter = m_connections.begin(); iter != m_connections.end(); ++iter) {
    delete iter->second;
  }
}